

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_failprob.c
# Opt level: O3

int zero_overhead_test(int K,int nTest,float loss)

{
  long lVar1;
  RqInterProgram *__ptr;
  float loss_00;
  int iVar2;
  uint32_t *ESIs;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  undefined8 uStack_50;
  ulong local_48;
  RqInterProgram *local_40;
  RqInterProgram *program;
  
  if (nTest < 1) {
    uVar5 = 0;
  }
  else {
    local_48 = (ulong)(uint)K * 4 + 0xf & 0xfffffffffffffff0;
    uVar5 = 0;
    uVar4 = 0;
    program._0_4_ = nTest;
    program._4_4_ = loss;
    do {
      loss_00 = program._4_4_;
      lVar1 = -local_48;
      ESIs = (uint32_t *)((long)&local_48 + lVar1);
      if ((program._4_4_ != 1.0) || (NAN(program._4_4_))) {
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10146c;
        get_esis_after_loss(K,ESIs,loss_00);
      }
      else {
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10145f;
        get_random_esis(K,ESIs);
      }
      local_40 = (RqInterProgram *)0x0;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x101486;
      iVar2 = getProgram(K,K,ESIs,&local_40);
      if (iVar2 != 0) {
        if (iVar2 != -4) {
          return -1;
        }
        uVar5 = uVar5 + 1;
      }
      if ((int)(uVar4 / 1000) * 1000 == (int)uVar4) {
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1014bf;
        printf("   Completed test %d, nFail=%d\n",uVar4,(ulong)uVar5);
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1014ce;
        fflush(_stdout);
      }
      __ptr = local_40;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1014d7;
      free(__ptr);
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while ((uint)program != uVar3);
  }
  return uVar5;
}

Assistant:

int zero_overhead_test(int K, int nTest, float loss)
{
#define RUN_NOFAIL(x) \
	do { \
		int RUN_NOFAIL_err; \
		if ((RUN_NOFAIL_err = (x)) != 0) { \
			fprintf(stderr, "Error:%s:%d:  %s failed: %d\n", \
				__FILE__, __LINE__, #x, RUN_NOFAIL_err); \
			if (config) \
				free(config); \
			return -1; \
		} \
	} while(0)

	int nFail = 0;
	for (int i = 0; i < nTest; ++i) {
		uint32_t ESIs[K];
		if (loss == 1) {
			get_random_esis(K, ESIs);
		} else {
			get_esis_after_loss(K, ESIs, loss);
		}

		/* Create the program */
		RqInterProgram* program = NULL;
		int err = getProgram(K, K, ESIs, &program);
		switch (err) {
		case 0:						break;
		case RQ_ERR_INSUFF_IDS:	++nFail;	break;
		default:
			return -1;
		};

		if (i % 1000 == 0) {
			printf("   Completed test %d, nFail=%d\n", i, nFail);
			fflush(stdout);
		}

		free(program);
	}

#undef RUN_NOFAIL
	return nFail;
}